

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViaCoroutine.h
# Opt level: O2

ValueAwaiter __thiscall
async_simple::coro::detail::
coAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
          (detail *this,Executor *ex,Lazy<std::pair<std::error_code,_unsigned_long>_> *awaitable)

{
  Handle HVar1;
  void *in_RAX;
  Handle local_18;
  
  local_18.__handle_ = in_RAX;
  Lazy<std::pair<std::error_code,_unsigned_long>_>::coAwait
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)&local_18,(Executor *)awaitable);
  HVar1.__handle_ = local_18.__handle_;
  local_18.__handle_ = (void *)0x0;
  *(void **)this = HVar1.__handle_;
  LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::~LazyAwaiterBase
            ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)&local_18);
  return (AwaiterBase)(AwaiterBase)this;
}

Assistant:

inline auto coAwait(Executor* ex, Awaitable&& awaitable) {
    if constexpr (detail::HasCoAwaitMethod<Awaitable>) {
        return detail::getAwaiter(
            std::forward<Awaitable>(awaitable).coAwait(ex));
    } else {
        using AwaiterType =
            decltype(detail::getAwaiter(std::forward<Awaitable>(awaitable)));
        return ViaAsyncAwaiter<std::decay_t<AwaiterType>>(
            ex, std::forward<Awaitable>(awaitable));
    }
}